

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

int __thiscall cmCTestScriptHandler::PerformExtraUpdates(cmCTestScriptHandler *this)

{
  pointer pbVar1;
  cmCTest *this_00;
  bool bVar2;
  ostream *poVar3;
  pointer pbVar4;
  string_view arg;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cvsArgs;
  string output;
  string fullCommand;
  string command;
  cmAlphaNum local_1f8;
  string local_1c8;
  ostringstream cmCTestLog_msg;
  
  command._M_dataplus._M_p = (pointer)&command.field_2;
  command._M_string_length = 0;
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  command.field_2._M_local_buf[0] = '\0';
  output.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&command);
  pbVar4 = (this->ExtraUpdates).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->ExtraUpdates).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar4 == pbVar1) {
LAB_00196166:
      std::__cxx11::string::~string((string *)&output);
      std::__cxx11::string::~string((string *)&command);
      return 0;
    }
    arg._M_str = (pbVar4->_M_dataplus)._M_p;
    arg._M_len = pbVar4->_M_string_length;
    cmExpandedList_abi_cxx11_(&cvsArgs,arg,false);
    if ((long)cvsArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)cvsArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      _cmCTestLog_msg = command._M_string_length;
      local_1f8.View_._M_len = 8;
      local_1f8.View_._M_str = " update ";
      cmStrCat<std::__cxx11::string>
                (&fullCommand,(cmAlphaNum *)&cmCTestLog_msg,&local_1f8,
                 cvsArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1);
      output._M_string_length = 0;
      *output._M_dataplus._M_p = '\0';
      retVal = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Run Update: ");
      poVar3 = std::operator<<(poVar3,(string *)&fullCommand);
      std::endl<char,std::char_traits<char>>(poVar3);
      this_00 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_00,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                   ,0x27e,(char *)local_1f8.View_._M_len,false);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      bVar2 = cmSystemTools::RunSingleCommand
                        (&fullCommand,&output,&output,&retVal,
                         ((cvsArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                         (this->super_cmCTestGenericHandler).HandlerVerbose,(cmDuration)0x0);
      if (!bVar2 || retVal != 0) {
        _cmCTestLog_msg = 0x21;
        local_1f8.View_._M_str = (pbVar4->_M_dataplus)._M_p;
        local_1f8.View_._M_len = pbVar4->_M_string_length;
        cmStrCat<char[15],std::__cxx11::string>
                  (&local_1c8,(cmAlphaNum *)&cmCTestLog_msg,&local_1f8,
                   (char (*) [15])"\nWith output:\n",&output);
        cmSystemTools::Error(&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&fullCommand);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&cvsArgs);
        goto LAB_00196166;
      }
      std::__cxx11::string::~string((string *)&fullCommand);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cvsArgs);
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

int cmCTestScriptHandler::PerformExtraUpdates()
{
  std::string command;
  std::string output;
  int retVal;
  bool res;

  // do an initial cvs update as required
  command = this->UpdateCmd;
  for (std::string const& eu : this->ExtraUpdates) {
    std::vector<std::string> cvsArgs = cmExpandedList(eu);
    if (cvsArgs.size() == 2) {
      std::string fullCommand = cmStrCat(command, " update ", cvsArgs[1]);
      output.clear();
      retVal = 0;
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "Run Update: " << fullCommand << std::endl);
      res = cmSystemTools::RunSingleCommand(
        fullCommand, &output, &output, &retVal, cvsArgs[0].c_str(),
        this->HandlerVerbose, cmDuration::zero() /*this->TimeOut*/);
      if (!res || retVal != 0) {
        cmSystemTools::Error(cmStrCat("Unable to perform extra updates:\n", eu,
                                      "\nWith output:\n", output));
        return 0;
      }
    }
  }
  return 0;
}